

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

void __thiscall script_tests::script_CHECKMULTISIG12::test_method(script_CHECKMULTISIG12 *this)

{
  uint uVar1;
  uint uVar2;
  readonly_property<bool> rVar3;
  bool bVar4;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  CMutableTransaction txTo12;
  CKey key3;
  CKey key2;
  CKey key1;
  ScriptError err;
  CScript badsig1;
  CScript goodsig2;
  CScript goodsig1;
  CTransaction txFrom12;
  CScript scriptPubKey12;
  check_type cVar8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  assertion_result local_3a0;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 local_248 [16];
  pointer local_238;
  vector<CTxOut,_std::allocator<CTxOut>_> local_230;
  undefined1 local_210 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_208;
  undefined1 local_200 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_1f8;
  undefined1 local_1f0 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_1e8;
  ScriptError local_1dc;
  undefined1 local_1d8 [16];
  shared_count asStack_1c8 [2];
  undefined1 local_1b8 [16];
  shared_count asStack_1a8 [2];
  undefined1 local_198 [16];
  _func_int *local_188 [2];
  undefined1 local_178 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_160 [4];
  direct_or_indirect local_f8;
  uint local_dc;
  CTransaction local_d8;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(local_1f0,0));
  GenerateRandomKey(false);
  GenerateRandomKey(SUB81(local_210,0));
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             (uchar *)&local_d8);
  CKey::GetPubKey((CPubKey *)&local_d8,(CKey *)local_1f0);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_248,(CPubKey *)&local_d8
            );
  b._M_extent._M_extent_value = local_248._8_8_ - local_248._0_8_;
  b._M_ptr = (pointer)local_248._0_8_;
  this_00 = CScript::operator<<((CScript *)local_58,b);
  CKey::GetPubKey((CPubKey *)local_178,(CKey *)local_200);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8.indirect_contents,
             (CPubKey *)local_178);
  b_00._M_extent._M_extent_value = local_f8._8_8_ - local_f8._0_8_;
  b_00._M_ptr = (pointer)local_f8.indirect_contents.indirect;
  this_01 = &CScript::operator<<(this_00,b_00)->super_CScriptBase;
  uVar1 = this_01->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_01->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar5 = this_01;
  }
  local_198[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar5->_union + (long)(int)uVar2),local_198);
  uVar1 = this_01->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_01->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar5 = this_01;
  }
  local_198[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_01,(uchar *)((long)&ppVar5->_union + (long)(int)uVar2),local_198);
  if ((pointer)local_f8.indirect_contents.indirect != (pointer)0x0) {
    operator_delete(local_f8.indirect_contents.indirect,local_f8._16_8_ - local_f8._0_8_);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,(long)local_238 - local_248._0_8_);
  }
  BuildCreditingTransaction((CMutableTransaction *)local_178,(CScript *)local_58,0);
  CTransaction::CTransaction(&local_d8,(CMutableTransaction *)local_178);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  local_178._16_8_ = (pointer)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_f8.indirect_contents.indirect = (char *)0x0;
  local_f8._8_8_ = 0;
  local_f8._16_8_ = 0;
  BuildSpendingTransaction
            ((CMutableTransaction *)local_248,(CScript *)local_178,
             (CScriptWitness *)&local_f8.indirect_contents,&local_d8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_f8.indirect_contents);
  if (0x1c < avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_178._0_8_);
    local_178._0_8_ = (pointer)0x0;
  }
  CTransaction::CTransaction((CTransaction *)local_178,(CMutableTransaction *)local_248);
  sign_multisig((CScript *)&local_f8.indirect_contents,(CScript *)local_58,(CKey *)local_1f0,
                (CTransaction *)local_178);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x41a;
  file.m_begin = (iterator)&local_258;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
  local_178._0_8_ = &PTR_CheckECDSASignature_013ae1e0;
  local_178._16_8_ = (pointer)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_178._8_8_ = (pointer)local_248;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript((CScript *)&local_f8.indirect_contents,(CScript *)local_58,(CScriptWitness *)0x0
                    ,3,(BaseSignatureChecker *)local_178,&local_1dc);
  local_1b8._8_8_ = (element_type *)0x0;
  asStack_1a8[0].pi_ = (sp_counted_base *)0x0;
  local_1d8._0_8_ =
       "VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_1d8._8_8_ = "";
  local_198[8] = false;
  local_198._0_8_ = &PTR__lazy_ostream_013abc70;
  local_188[0] = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_270 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_188[1] = (_func_int *)local_1d8;
  local_1b8[0] = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,0,WARN,_cVar8,
             (size_t)&local_278,0x41a);
  boost::detail::shared_count::~shared_count(asStack_1a8);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x41b;
  file_00.m_begin = (iterator)&local_288;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  local_1b8[0] = local_1dc == SCRIPT_ERR_OK;
  local_1b8._8_8_ = (element_type *)0x0;
  asStack_1a8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_198,local_1dc);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013aba30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)local_178,1,1,WARN,_cVar8,
             (size_t)&local_2a8,0x41b);
  if ((_func_int **)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)((long)local_188[0] + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_1a8);
  (local_230.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 2;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x41d;
  file_01.m_begin = (iterator)&local_2b8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c8,
             msg_01);
  local_178._0_8_ = &PTR_CheckECDSASignature_013ae1e0;
  local_178._16_8_ = (pointer)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_178._8_8_ = (pointer)local_248;
  bVar4 = VerifyScript((CScript *)&local_f8.indirect_contents,(CScript *)local_58,
                       (CScriptWitness *)0x0,3,(BaseSignatureChecker *)local_178,&local_1dc);
  local_1b8._8_8_ = (element_type *)0x0;
  asStack_1a8[0].pi_ = (sp_counted_base *)0x0;
  local_1d8._0_8_ =
       "!VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_1d8._8_8_ = "";
  local_198[8] = false;
  local_198._0_8_ = &PTR__lazy_ostream_013abc70;
  local_188[0] = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_188[1] = (_func_int *)local_1d8;
  local_1b8[0] = !bVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)local_198,1,0,WARN,_cVar8,
             (size_t)&local_2d8,0x41d);
  boost::detail::shared_count::~shared_count(asStack_1a8);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x41e;
  file_02.m_begin = (iterator)&local_2e8;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f8,
             msg_02);
  local_1b8[0] = local_1dc == SCRIPT_ERR_EVAL_FALSE;
  local_1b8._8_8_ = (element_type *)0x0;
  asStack_1a8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_198,local_1dc);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013aba30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_300 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)local_178,1,1,WARN,_cVar8,
             (size_t)&local_308,0x41e);
  if ((_func_int **)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)((long)local_188[0] + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_1a8);
  CTransaction::CTransaction((CTransaction *)local_178,(CMutableTransaction *)local_248);
  sign_multisig((CScript *)local_198,(CScript *)local_58,(CKey *)local_200,(CTransaction *)local_178
               );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x421;
  file_03.m_begin = (iterator)&local_318;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_328,
             msg_03);
  local_178._0_8_ = &PTR_CheckECDSASignature_013ae1e0;
  local_178._16_8_ = (pointer)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_178._8_8_ = (pointer)local_248;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript((CScript *)local_198,(CScript *)local_58,(CScriptWitness *)0x0,3,
                    (BaseSignatureChecker *)local_178,&local_1dc);
  local_1d8._8_8_ = (element_type *)0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  asStack_1a8[1].pi_ = (sp_counted_base *)&local_3a0;
  local_3a0._0_8_ =
       "VerifyScript(goodsig2, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_3a0.m_message.px = (element_type *)0xed0d43;
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_013abc70;
  asStack_1a8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_330 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1d8[0] = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_1b8,1,0,WARN,_cVar8,
             (size_t)&local_338,0x421);
  boost::detail::shared_count::~shared_count(asStack_1c8);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x422;
  file_04.m_begin = (iterator)&local_348;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_358,
             msg_04);
  local_1d8[0] = (class_property<bool>)(class_property<bool>)(local_1dc == SCRIPT_ERR_OK);
  local_1d8._8_8_ = (element_type *)0x0;
  asStack_1c8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_1b8,local_1dc);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013aba30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_360 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)local_178,1,1,WARN,_cVar8,
             (size_t)&local_368,0x422);
  if ((shared_count *)local_1b8._0_8_ != asStack_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)((long)asStack_1a8[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_1c8);
  CTransaction::CTransaction((CTransaction *)local_178,(CMutableTransaction *)local_248);
  sign_multisig((CScript *)local_1b8,(CScript *)local_58,(CKey *)local_210,(CTransaction *)local_178
               );
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_160);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_178);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x425;
  file_05.m_begin = (iterator)&local_378;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  local_178._0_8_ = &PTR_CheckECDSASignature_013ae1e0;
  local_178._16_8_ = (pointer)0x0;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_178._8_8_ = (pointer)local_248;
  bVar4 = VerifyScript((CScript *)local_1b8,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_178,&local_1dc);
  local_3a0.m_message.px = (element_type *)0x0;
  local_3a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_1c8[1].pi_ = (sp_counted_base *)&local_3b0;
  local_3b0 = 
  "!VerifyScript(badsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_3a8 = "";
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_013abc70;
  asStack_1c8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3b8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_3a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a0,(lazy_ostream *)local_1d8,1,0,WARN,_cVar8,(size_t)&local_3c0,0x425);
  boost::detail::shared_count::~shared_count(&local_3a0.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x426;
  file_06.m_begin = (iterator)&local_3d0;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e0,
             msg_06);
  local_3a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_1dc == SCRIPT_ERR_EVAL_FALSE);
  local_3a0.m_message.px = (element_type *)0x0;
  local_3a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_1d8,local_1dc);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178._0_8_ = &PTR__lazy_ostream_013aba30;
  local_178._16_8_ = boost::unit_test::lazy_ostream::inst;
  avStack_160[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_3a0,(lazy_ostream *)local_178,1,1,WARN,0xecf2c0,(size_t)&stack0xfffffffffffffc10
             ,0x426);
  if ((shared_count *)local_1d8._0_8_ != asStack_1c8) {
    operator_delete((void *)local_1d8._0_8_,(ulong)((long)asStack_1c8[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(&local_3a0.m_message.pn);
  if (0x1c < (uint)asStack_1a8[1].pi_._4_4_) {
    free((void *)local_1b8._0_8_);
    local_1b8._0_8_ = (shared_count *)0x0;
  }
  if (0x1c < (uint)local_188[1]._4_4_) {
    free((void *)local_198._0_8_);
    local_198._0_8_ = (_func_int **)0x0;
  }
  if (0x1c < local_dc) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_230);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_248);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_d8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_d8.vin);
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
    local_58._0_8_ = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_208._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_208,
               local_208._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_1f8._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1f8,
               (array<unsigned_char,_32UL> *)
               local_1f8._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_1e8._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1e8,
               local_1e8._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG12)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();

    CScript scriptPubKey12;
    scriptPubKey12 << OP_1 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    const CTransaction txFrom12{BuildCreditingTransaction(scriptPubKey12)};
    CMutableTransaction txTo12 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom12);

    CScript goodsig1 = sign_multisig(scriptPubKey12, key1, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    txTo12.vout[0].nValue = 2;
    BOOST_CHECK(!VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    CScript goodsig2 = sign_multisig(scriptPubKey12, key2, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    CScript badsig1 = sign_multisig(scriptPubKey12, key3, CTransaction(txTo12));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
}